

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.cpp
# Opt level: O3

void __thiscall xmrig::Base::start(Base *this)

{
  bool bVar1;
  int iVar2;
  Watcher *this_00;
  undefined4 extraout_var;
  
  Api::start(this->d_ptr->api);
  bVar1 = Config::isShouldSave(this->d_ptr->config);
  if (bVar1) {
    (*(this->d_ptr->config->super_BaseConfig).super_IConfig._vptr_IConfig[4])();
  }
  iVar2 = (*(this->d_ptr->config->super_BaseConfig).super_IConfig._vptr_IConfig[2])();
  if ((char)iVar2 != '\0') {
    this_00 = (Watcher *)operator_new(0x30);
    iVar2 = (*(this->d_ptr->config->super_BaseConfig).super_IConfig._vptr_IConfig[5])();
    Watcher::Watcher(this_00,(String *)CONCAT44(extraout_var,iVar2),&this->super_IWatcherListener);
    this->d_ptr->watcher = this_00;
  }
  return;
}

Assistant:

void xmrig::Base::start()
{
#   ifdef XMRIG_FEATURE_API
    api()->start();
#   endif

    if (config()->isShouldSave()) {
        config()->save();
    }

    if (config()->isWatch()) {
        d_ptr->watcher = new Watcher(config()->fileName(), this);
    }
}